

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O3

IterateResult __thiscall glcts::BlendEquationSeparateCase::ModeCase::iterate(ModeCase *this)

{
  ContextInfo *pCVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var5;
  undefined4 extraout_var;
  char *description;
  qpTestResult testResult;
  TestContext *this_00;
  GLint rgbEq;
  GLint alphaEq;
  char *local_40;
  int local_34;
  long lVar6;
  
  pCVar1 = ((this->super_TestCase).m_context)->m_contextInfo;
  local_40 = "GL_KHR_blend_equation_advanced";
  _Var5 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const*const>>
                    ((pCVar1->m_extensions).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (pCVar1->m_extensions).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  if (_Var5._M_current ==
      (pCVar1->m_extensions).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "GL_KHR_blend_equation_advanced";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  else {
    iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar6 = CONCAT44(extraout_var,iVar2);
    (**(code **)(lVar6 + 0x108))(this->m_mode,0x8006);
    iVar3 = (**(code **)(lVar6 + 0x800))();
    local_40 = (char *)((ulong)local_40 & 0xffffffff00000000);
    (**(code **)(lVar6 + 0x868))(0x8009,&local_40);
    iVar2 = (int)local_40;
    (**(code **)(lVar6 + 0x108))(0x8006,this->m_mode);
    iVar4 = (**(code **)(lVar6 + 0x800))();
    local_34 = 0;
    (**(code **)(lVar6 + 0x868))(0x883d,&local_34);
    testResult = (qpTestResult)
                 (local_34 != 0x8006 || (iVar4 != 0x500 || (iVar2 != 0x8006 || iVar3 != 0x500)));
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Pass";
    if (local_34 != 0x8006 || (iVar4 != 0x500 || (iVar2 != 0x8006 || iVar3 != 0x500))) {
      description = "Fail";
    }
  }
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

IterateResult iterate(void)
		{
			// Check that extension is supported.
			if (!IsExtensionSupported(m_context, "GL_KHR_blend_equation_advanced"))
			{
				m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "GL_KHR_blend_equation_advanced");
				return STOP;
			}

			const glw::Functions& gl = m_context.getRenderContext().getFunctions();

			// Set separate blend equations.
			// Expect error and that default value (FUNC_ADD) is not changed.

			// RGB.
			gl.blendEquationSeparate(m_mode, GL_FUNC_ADD);
			bool	   rgbOk = gl.getError() == GL_INVALID_ENUM;
			glw::GLint rgbEq = GL_NONE;
			gl.getIntegerv(GL_BLEND_EQUATION_RGB, &rgbEq);
			rgbOk = rgbOk && (rgbEq == GL_FUNC_ADD);

			// Alpha.
			gl.blendEquationSeparate(GL_FUNC_ADD, m_mode);
			bool	   alphaOk = gl.getError() == GL_INVALID_ENUM;
			glw::GLint alphaEq = GL_NONE;
			gl.getIntegerv(GL_BLEND_EQUATION_ALPHA, &alphaEq);
			alphaOk = alphaOk && (alphaEq == GL_FUNC_ADD);

			bool pass = rgbOk && alphaOk;
			m_testCtx.setTestResult(pass ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, pass ? "Pass" : "Fail");
			return STOP;
		}